

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

wchar_t terminal_clear_arrow(EditLine *el,wchar_t *name)

{
  funckey_t *pfVar1;
  int iVar2;
  int local_2c;
  wchar_t i;
  funckey_t *arrow;
  wchar_t *name_local;
  EditLine *el_local;
  
  pfVar1 = (el->el_terminal).t_fkey;
  local_2c = 0;
  while( true ) {
    if (6 < local_2c) {
      return L'\xffffffff';
    }
    iVar2 = wcscmp(name,pfVar1[local_2c].name);
    if (iVar2 == 0) break;
    local_2c = local_2c + 1;
  }
  pfVar1[local_2c].type = L'\x02';
  return L'\0';
}

Assistant:

libedit_private int
terminal_clear_arrow(EditLine *el, const wchar_t *name)
{
	funckey_t *arrow = el->el_terminal.t_fkey;
	int i;

	for (i = 0; i < A_K_NKEYS; i++)
		if (wcscmp(name, arrow[i].name) == 0) {
			arrow[i].type = XK_NOD;
			return 0;
		}
	return -1;
}